

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::HashTable
          (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this,ArenaAllocator *allocator,
          uint tableSize)

{
  char *name;
  DictionaryStats *pDVar1;
  uint tableSize_local;
  ArenaAllocator *allocator_local;
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this_local;
  
  this->alloc = allocator;
  this->tableSize = tableSize;
  Init(this);
  name = std::type_info::name
                   ((type_info *)&HashTable<ObjWriteGuardBucket,Memory::ArenaAllocator>*::typeinfo);
  pDVar1 = DictionaryStats::Create(name,tableSize);
  this->stats = pDVar1;
  return;
}

Assistant:

HashTable(TAllocator * allocator, DECLSPEC_GUARD_OVERFLOW uint tableSize) : alloc(allocator), tableSize(tableSize)
    {
        Init();
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), tableSize);
#endif
    }